

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadTorus>::Write
          (TPZGeoElRefLess<pzgeom::TPZQuadTorus> *this,TPZStream *buf,int withclassid)

{
  undefined4 in_EDX;
  undefined8 in_RSI;
  TPZQuadTorus *in_RDI;
  double *pdVar1;
  TPZGeoEl *unaff_retaddr;
  uint i;
  TPZStream *in_stack_ffffffffffffffd8;
  uint local_18;
  
  TPZGeoEl::Write(unaff_retaddr,(TPZStream *)in_RDI,(int)((ulong)in_RSI >> 0x20));
  pzgeom::TPZQuadTorus::Write(in_RDI,in_stack_ffffffffffffffd8,0);
  for (local_18 = 0; local_18 < 9; local_18 = local_18 + 1) {
    pdVar1 = in_RDI[1].fOrigin.fExtAlloc + (ulong)local_18 * 3 + -3;
    (**(code **)((long)*pdVar1 + 0x28))(pdVar1,in_RSI,in_EDX);
  }
  return;
}

Assistant:

void TPZGeoElRefLess<TGeo>::Write(TPZStream &buf, int withclassid) const {
    TPZGeoEl::Write(buf, withclassid);
    fGeo.Write(buf, withclassid);
    for (unsigned int i = 0; i < TGeo::NSides; ++i) {
        this->fNeighbours[i].Write(buf, withclassid);
    }
}